

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O2

void __thiscall pbrt::Image::SetChannel(Image *this,Point2i p,int c,Float value)

{
  PixelFormat PVar1;
  span<const_float> vin;
  span<unsigned_char> vout;
  int c_local;
  Point2i p_local;
  Float value_local;
  Half local_12;
  
  c_local = c;
  p_local.super_Tuple2<pbrt::Point2,_int> = p.super_Tuple2<pbrt::Point2,_int>;
  value_local = value;
  if (NAN(value)) {
    if (LOGGING_LogLevel < 2) {
      Log<int&,int&,int&>(Error,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.h"
                          ,0x13f,"NaN at pixel %d,%d comp %d",(int *)&p_local,
                          &p_local.super_Tuple2<pbrt::Point2,_int>.y,&c_local);
    }
    value_local = 0.0;
  }
  PVar1 = this->format;
  if (PVar1 == Float) {
    (this->p32).ptr
    [(long)((p_local.super_Tuple2<pbrt::Point2,_int>.y *
             (this->resolution).super_Tuple2<pbrt::Point2,_int>.x +
            p_local.super_Tuple2<pbrt::Point2,_int>.x) * (int)(this->channelNames).nStored) +
     (long)c_local] = value_local;
  }
  else if (PVar1 == Half) {
    Half::Half(&local_12,value_local);
    (this->p16).ptr
    [(long)((p_local.super_Tuple2<pbrt::Point2,_int>.y *
             (this->resolution).super_Tuple2<pbrt::Point2,_int>.x +
            p_local.super_Tuple2<pbrt::Point2,_int>.x) * (int)(this->channelNames).nStored) +
     (long)c_local].h = local_12.h;
  }
  else {
    if (PVar1 != U256) {
      LogFatal(Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.h"
               ,0x14f,"Unhandled PixelFormat in Image::SetChannel()");
    }
    vout.ptr = (this->p8).ptr +
               (long)c_local +
               (long)((p_local.super_Tuple2<pbrt::Point2,_int>.y *
                       (this->resolution).super_Tuple2<pbrt::Point2,_int>.x +
                      p_local.super_Tuple2<pbrt::Point2,_int>.x) * (int)(this->channelNames).nStored
                     );
    vin.n = 1;
    vin.ptr = &value_local;
    vout.n = 1;
    ColorEncodingHandle::FromLinear(&this->encoding,vin,vout);
  }
  return;
}

Assistant:

PBRT_CPU_GPU
    void SetChannel(Point2i p, int c, Float value) {
        // CHECK(!IsNaN(value));
        if (IsNaN(value)) {
#ifndef PBRT_IS_GPU_CODE
            LOG_ERROR("NaN at pixel %d,%d comp %d", p.x, p.y, c);
#endif
            value = 0;
        }

        switch (format) {
        case PixelFormat::U256:
            encoding.FromLinear({&value, 1}, {&p8[PixelOffset(p) + c], 1});
            break;
        case PixelFormat::Half:
            p16[PixelOffset(p) + c] = Half(value);
            break;
        case PixelFormat::Float:
            p32[PixelOffset(p) + c] = value;
            break;
        default:
            LOG_FATAL("Unhandled PixelFormat in Image::SetChannel()");
        }
    }